

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

DnsHashEntry * __thiscall DnsHashEntry::CreateCopy(DnsHashEntry *this)

{
  uint uVar1;
  DnsHashEntry *pDVar2;
  
  pDVar2 = (DnsHashEntry *)operator_new(0x60);
  pDVar2->HashNext = (DnsHashEntry *)0x0;
  pDVar2->hash = 0;
  pDVar2->registry_id = 0;
  pDVar2->count = 0;
  pDVar2->key_type = 0;
  pDVar2->key_length = 0;
  (pDVar2->field_6).key_number = 0;
  pDVar2->registry_id = this->registry_id;
  pDVar2->key_type = this->key_type;
  uVar1 = this->key_length;
  pDVar2->key_length = uVar1;
  memcpy(&pDVar2->field_6,&this->field_6,(ulong)uVar1);
  pDVar2->count = this->count;
  return pDVar2;
}

Assistant:

DnsHashEntry * DnsHashEntry::CreateCopy()
{
    DnsHashEntry * key = new DnsHashEntry();

    if (key != NULL)
    {
        key->registry_id = registry_id;
        key->key_type = key_type;
        key->key_length = key_length;
        memcpy(key->key_value, key_value, key_length);
        key->count = count;
    }

    return key;
}